

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_andi_16(m68k_info *info)

{
  uint imm;
  
  imm = read_imm_16(info);
  build_imm_ea(info,8,'\x02',imm);
  return;
}

Assistant:

static void d68000_andi_16(m68k_info *info)
{
	build_imm_ea(info, M68K_INS_ANDI, 2, read_imm_16(info));
}